

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiNodeAnim *pNodeAnim)

{
  uint local_4c;
  double dStack_48;
  uint i_2;
  double dLast_2;
  double dStack_38;
  uint i_1;
  double dLast_1;
  double dStack_28;
  uint i;
  double dLast;
  aiNodeAnim *pNodeAnim_local;
  aiAnimation *pAnimation_local;
  ValidateDSProcess *this_local;
  
  Validate(this,&pNodeAnim->mNodeName);
  if (((pNodeAnim->mNumPositionKeys == 0) && (pNodeAnim->mScalingKeys == (aiVectorKey *)0x0)) &&
     (pNodeAnim->mNumRotationKeys == 0)) {
    ReportError(this,"Empty node animation channel");
  }
  if (pNodeAnim->mNumPositionKeys != 0) {
    if (pNodeAnim->mPositionKeys == (aiVectorKey *)0x0) {
      ReportError(this,"aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)",
                  (ulong)pNodeAnim->mNumPositionKeys);
    }
    dStack_28 = -100000000000.0;
    for (dLast_1._4_4_ = 0; dLast_1._4_4_ < pNodeAnim->mNumPositionKeys;
        dLast_1._4_4_ = dLast_1._4_4_ + 1) {
      if ((0.0 < pAnimation->mDuration) &&
         (pAnimation->mDuration + 0.001 < pNodeAnim->mPositionKeys[dLast_1._4_4_].mTime)) {
        ReportError(this,
                    "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                    ,(double)(float)pNodeAnim->mPositionKeys[dLast_1._4_4_].mTime,
                    (double)(float)pAnimation->mDuration,(ulong)dLast_1._4_4_);
      }
      if ((dLast_1._4_4_ != 0) && (pNodeAnim->mPositionKeys[dLast_1._4_4_].mTime <= dStack_28)) {
        ReportWarning(this,
                      "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller than aiAnimation::mPositionKeys[%i] (which is %.5f)"
                      ,(double)(float)pNodeAnim->mPositionKeys[dLast_1._4_4_].mTime,
                      (ulong)dLast_1._4_4_,(ulong)(dLast_1._4_4_ - 1));
      }
      dStack_28 = pNodeAnim->mPositionKeys[dLast_1._4_4_].mTime;
    }
  }
  if (pNodeAnim->mNumRotationKeys != 0) {
    if (pNodeAnim->mRotationKeys == (aiQuatKey *)0x0) {
      ReportError(this,"aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)",
                  (ulong)pNodeAnim->mNumRotationKeys);
    }
    dStack_38 = -100000000000.0;
    for (dLast_2._4_4_ = 0; dLast_2._4_4_ < pNodeAnim->mNumRotationKeys;
        dLast_2._4_4_ = dLast_2._4_4_ + 1) {
      if ((0.0 < pAnimation->mDuration) &&
         (pAnimation->mDuration + 0.001 < pNodeAnim->mRotationKeys[dLast_2._4_4_].mTime)) {
        ReportError(this,
                    "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                    ,(double)(float)pNodeAnim->mRotationKeys[dLast_2._4_4_].mTime,
                    (double)(float)pAnimation->mDuration,(ulong)dLast_2._4_4_);
      }
      if ((dLast_2._4_4_ != 0) && (pNodeAnim->mRotationKeys[dLast_2._4_4_].mTime <= dStack_38)) {
        ReportWarning(this,
                      "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller than aiAnimation::mRotationKeys[%i] (which is %.5f)"
                      ,(double)(float)pNodeAnim->mRotationKeys[dLast_2._4_4_].mTime,
                      (ulong)dLast_2._4_4_,(ulong)(dLast_2._4_4_ - 1));
      }
      dStack_38 = pNodeAnim->mRotationKeys[dLast_2._4_4_].mTime;
    }
  }
  if (pNodeAnim->mNumScalingKeys != 0) {
    if (pNodeAnim->mScalingKeys == (aiVectorKey *)0x0) {
      ReportError(this,"aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)",
                  (ulong)pNodeAnim->mNumScalingKeys);
    }
    dStack_48 = -100000000000.0;
    for (local_4c = 0; local_4c < pNodeAnim->mNumScalingKeys; local_4c = local_4c + 1) {
      if ((0.0 < pAnimation->mDuration) &&
         (pAnimation->mDuration + 0.001 < pNodeAnim->mScalingKeys[local_4c].mTime)) {
        ReportError(this,
                    "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                    ,(double)(float)pNodeAnim->mScalingKeys[local_4c].mTime,
                    (double)(float)pAnimation->mDuration,(ulong)local_4c);
      }
      if ((local_4c != 0) && (pNodeAnim->mScalingKeys[local_4c].mTime <= dStack_48)) {
        ReportWarning(this,
                      "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller than aiAnimation::mScalingKeys[%i] (which is %.5f)"
                      ,(double)(float)pNodeAnim->mScalingKeys[local_4c].mTime,(ulong)local_4c,
                      (ulong)(local_4c - 1));
      }
      dStack_48 = pNodeAnim->mScalingKeys[local_4c].mTime;
    }
  }
  if (((pNodeAnim->mNumScalingKeys == 0) && (pNodeAnim->mNumRotationKeys == 0)) &&
     (pNodeAnim->mNumPositionKeys == 0)) {
    ReportError(this,"A node animation channel must have at least one subtrack");
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiNodeAnim* pNodeAnim)
{
    Validate(&pNodeAnim->mNodeName);

    if (!pNodeAnim->mNumPositionKeys && !pNodeAnim->mScalingKeys && !pNodeAnim->mNumRotationKeys) {
        ReportError("Empty node animation channel");
    }
    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pNodeAnim->mNumPositionKeys)
    {
        if (!pNodeAnim->mPositionKeys)
        {
        	ReportError("aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)",
                pNodeAnim->mNumPositionKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumPositionKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pNodeAnim->mPositionKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mPositionKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mPositionKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mPositionKeys[i].mTime;
        }
    }
    // rotation keys
    if (pNodeAnim->mNumRotationKeys)
    {
        if (!pNodeAnim->mRotationKeys)
        {
            ReportError("aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)",
                pNodeAnim->mNumRotationKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumRotationKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mRotationKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mRotationKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mRotationKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mRotationKeys[i].mTime;
        }
    }
    // scaling keys
    if (pNodeAnim->mNumScalingKeys)
    {
        if (!pNodeAnim->mScalingKeys)   {
            ReportError("aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)",
                pNodeAnim->mNumScalingKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumScalingKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mScalingKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mScalingKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mScalingKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mScalingKeys[i].mTime;
        }
    }

    if (!pNodeAnim->mNumScalingKeys && !pNodeAnim->mNumRotationKeys &&
        !pNodeAnim->mNumPositionKeys)
    {
        ReportError("A node animation channel must have at least one subtrack");
    }
}